

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O1

void report_bad(bool passed,char *c)

{
  uchar *d;
  char *pcVar1;
  undefined7 in_register_00000039;
  
  pcVar1 = "FAIL";
  if ((int)CONCAT71(in_register_00000039,passed) != 0) {
    pcVar1 = "pass";
  }
  printf("%s: decoding bad  ",pcVar1);
  printf("[0x%02X,0x%02X,0x%02X,0x%02X]",(ulong)(byte)*c,(ulong)(byte)c[1],(ulong)(byte)c[2],
         (ulong)(byte)c[3]);
  putchar(0x20);
  return;
}

Assistant:

static void report_bad(bool passed, test_utf8_char const c)
{
  printf("%s: decoding bad  ", passed ? "pass" : "FAIL");
  test_utf8_char_print(c);
  printf(" ");
}